

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  undefined1 uVar2;
  key_type kVar3;
  key_type kVar4;
  key_type kVar5;
  key_type *key;
  AssertionResult *assertion_result;
  char *expected_predicate_value;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  type in_stack_ffffffffffffe188;
  type __p;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe190;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  uint *in_stack_ffffffffffffe198;
  uint *lhs;
  char *in_stack_ffffffffffffe1a0;
  char *message;
  undefined4 in_stack_ffffffffffffe1a8;
  undefined4 uVar6;
  int in_stack_ffffffffffffe1ac;
  int iVar7;
  char *in_stack_ffffffffffffe1b0;
  char *file;
  Type in_stack_ffffffffffffe1bc;
  Type type;
  AssertHelper *in_stack_ffffffffffffe1c0;
  AssertHelper *this_01;
  undefined8 in_stack_ffffffffffffe1d8;
  undefined4 in_stack_ffffffffffffe1e0;
  undefined4 in_stack_ffffffffffffe1e4;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe1e8;
  char *in_stack_ffffffffffffe1f0;
  undefined4 in_stack_ffffffffffffe1f8;
  undefined4 in_stack_ffffffffffffe1fc;
  char *in_stack_ffffffffffffe200;
  key_type *expression_text;
  AssertionResult *in_stack_ffffffffffffe208;
  undefined4 in_stack_ffffffffffffe210;
  undefined4 in_stack_ffffffffffffe214;
  key_type *in_stack_ffffffffffffe228;
  undefined4 in_stack_ffffffffffffe230;
  undefined4 in_stack_ffffffffffffe234;
  value_type *in_stack_ffffffffffffe2c8;
  undefined4 in_stack_ffffffffffffe2d0;
  undefined4 in_stack_ffffffffffffe2d4;
  key_type *in_stack_ffffffffffffe3a8;
  key_type *key_00;
  undefined7 in_stack_ffffffffffffe3b0;
  undefined1 in_stack_ffffffffffffe3b7;
  string local_1b80 [55];
  undefined1 local_1b49;
  AssertionResult local_1b48;
  key_type local_1b34;
  key_type local_1a7c;
  char *local_1a78;
  undefined4 local_1a6c;
  AssertionResult local_1a68;
  string local_1a58 [132];
  key_type local_19d4;
  undefined1 local_1979;
  AssertionResult local_1978;
  string local_1968 [55];
  undefined1 local_1931;
  AssertionResult local_1930;
  key_type local_191c;
  key_type local_1864;
  size_type local_1860;
  undefined4 local_1854;
  AssertionResult local_1850;
  string local_1840 [132];
  key_type local_17bc;
  undefined1 local_1761;
  AssertionResult local_1760;
  string local_1750 [55];
  undefined1 local_1719;
  AssertionResult local_1718;
  key_type local_1704;
  key_type local_164c;
  size_type local_1648;
  undefined4 local_163c;
  AssertionResult local_1638;
  string local_1628 [132];
  key_type local_15a4;
  undefined1 local_1549;
  AssertionResult local_1548;
  string local_1538 [55];
  undefined1 local_1501;
  AssertionResult local_1500;
  key_type local_14ec;
  key_type local_1434;
  size_type local_1430;
  undefined4 local_1424;
  AssertionResult local_1420;
  string local_1410 [132];
  key_type local_138c;
  undefined1 local_1331;
  AssertionResult local_1330;
  string local_1320 [55];
  undefined1 local_12e9;
  AssertionResult local_12e8 [2];
  key_type local_12c8;
  key_type local_12c4;
  AssertionResult local_12c0;
  string local_12b0 [55];
  undefined1 local_1279;
  AssertionResult local_1278;
  key_type local_1264;
  key_type local_11ac;
  size_type local_11a8;
  undefined4 local_119c;
  AssertionResult local_1198;
  string local_1188 [132];
  key_type local_1104;
  undefined1 local_10a9;
  AssertionResult local_10a8;
  string local_1098 [55];
  undefined1 local_1061;
  AssertionResult local_1060 [2];
  key_type local_1040;
  key_type local_103c;
  AssertionResult local_1038;
  string local_1028 [55];
  undefined1 local_ff1;
  AssertionResult local_ff0;
  key_type local_fdc;
  key_type local_f24;
  size_type local_f20;
  undefined4 local_f14;
  AssertionResult local_f10;
  string local_f00 [132];
  key_type local_e7c;
  undefined1 local_e21;
  AssertionResult local_e20;
  string local_e10 [55];
  undefined1 local_dd9;
  AssertionResult local_dd8 [2];
  key_type local_db8;
  key_type local_db4;
  AssertionResult local_db0;
  string local_da0 [55];
  undefined1 local_d69;
  AssertionResult local_d68;
  key_type local_d54;
  key_type local_c9c;
  size_type local_c98;
  undefined4 local_c8c;
  AssertionResult local_c88;
  string local_c78 [132];
  key_type local_bf4;
  undefined1 local_b99;
  AssertionResult local_b98;
  string local_b88 [55];
  undefined1 local_b51;
  AssertionResult local_b50 [2];
  key_type local_b30;
  key_type local_b2c;
  AssertionResult local_b28;
  string local_b18 [55];
  undefined1 local_ae1;
  AssertionResult local_ae0;
  key_type local_acc;
  key_type local_a14;
  size_type local_a10;
  undefined4 local_a04;
  AssertionResult local_a00;
  string local_9f0 [132];
  key_type local_96c;
  undefined1 local_911;
  AssertionResult local_910 [12];
  key_type local_850;
  key_type local_84c;
  AssertionResult local_848;
  key_type local_834;
  type local_830;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_828;
  uint *local_820;
  char *pcStack_818;
  undefined8 local_810;
  char *pcStack_808;
  undefined8 local_800;
  AssertHelper *pAStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  size_type local_780;
  undefined4 local_774;
  AssertionResult local_770 [6];
  value_type local_704;
  value_type local_6a4;
  value_type local_644;
  value_type local_5e4;
  value_type local_584;
  value_type local_524;
  value_type local_4c4;
  value_type local_464;
  string local_460 [55];
  byte local_429;
  AssertionResult local_428 [6];
  value_type local_3bc;
  string local_3b8 [55];
  undefined1 local_381;
  AssertionResult local_380;
  key_type local_36c;
  key_type local_2b4;
  size_type local_2b0;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  string local_290 [132];
  key_type local_20c;
  undefined1 local_1b1;
  AssertionResult local_1b0;
  string local_1a0 [71];
  undefined1 local_159;
  AssertionResult local_158 [11];
  key_type local_a8 [42];
  
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffe190);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffe190);
  local_159 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::empty((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xd0083a);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe190,(bool *)in_stack_ffffffffffffe188,
             (type *)0xd0085c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b0,
               in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe190);
    std::__cxx11::string::~string(local_1a0);
    testing::Message::~Message((Message *)0xd0091d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd009b4);
  local_20c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe190,(int)((ulong)in_stack_ffffffffffffe188 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_1b1 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffe190,(iterator *)in_stack_ffffffffffffe188);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe190,(bool *)in_stack_ffffffffffffe188,
             (type *)0xd00a49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b0,
               in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe190);
    std::__cxx11::string::~string(local_290);
    testing::Message::~Message((Message *)0xd00b1c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd00bb3);
  local_2a4 = 0;
  local_2b4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe190,(int)((ulong)in_stack_ffffffffffffe188 >> 0x20))
  ;
  local_2b0 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_ffffffffffffe190,(key_type *)in_stack_ffffffffffffe188);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8),
             in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,
             (unsigned_long *)in_stack_ffffffffffffe190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe1c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd00c74);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b0,
               in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe190);
    testing::Message::~Message((Message *)0xd00cd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd00d48);
  local_36c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe190,(int)((ulong)in_stack_ffffffffffffe188 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                in_stack_ffffffffffffe3a8);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  local_381 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffe190,(iterator *)in_stack_ffffffffffffe188);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe190,(bool *)in_stack_ffffffffffffe188,
             (type *)0xd00ddd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b0,
               in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe190);
    std::__cxx11::string::~string(local_3b8);
    testing::Message::~Message((Message *)0xd00eb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd00f47);
  local_3bc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,
                             (int)((ulong)in_stack_ffffffffffffe188 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd00f9d);
  local_429 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe190,(bool *)in_stack_ffffffffffffe188,
             (type *)0xd00fc1);
  iVar7 = (int)((ulong)in_stack_ffffffffffffe188 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b0,
               in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe190);
    std::__cxx11::string::~string(local_460);
    testing::Message::~Message((Message *)0xd01094);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0112b);
  local_464 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_4c4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_524 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_584 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_5e4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_644 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_6a4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_704 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffe2d4,in_stack_ffffffffffffe2d0),
           in_stack_ffffffffffffe2c8);
  local_774 = 9;
  local_780 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd0136f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8),
             in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198,
             (unsigned_long *)in_stack_ffffffffffffe190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_770);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe1c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd013e8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1bc,in_stack_ffffffffffffe1b0,
               in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe190);
    testing::Message::~Message((Message *)0xd0144b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd014bc);
  local_834 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe190,iVar7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  type = (Type)((ulong)local_800 >> 0x20);
  uVar6 = (undefined4)local_810;
  iVar7 = (int)((ulong)local_810 >> 0x20);
  it_00.super_iterator.pos.row_begin._M_current._0_4_ = uVar6;
  it_00.super_iterator.ht =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_818;
  it_00.super_iterator.pos.row_begin._M_current._4_4_ = iVar7;
  it_00.super_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pcStack_808;
  it_00.super_iterator.pos.row_current._M_current._0_4_ = (int)local_800;
  it_00.super_iterator.pos.row_current._M_current._4_4_ = type;
  it_00.super_iterator.pos.col_current = (nonempty_iterator)pAStack_7f8;
  it_00.super_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_7f0;
  it_00.super_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_7e8;
  it_00.super_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_ffffffffffffe1d8;
  it_00.super_iterator.end.col_current._0_4_ = in_stack_ffffffffffffe1e0;
  it_00.super_iterator.end.col_current._4_4_ = in_stack_ffffffffffffe1e4;
  it_00.parent_ = in_stack_ffffffffffffe1e8;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)pHStack_828,it_00);
  local_84c = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd01559);
  local_850 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(pHStack_828,(int)((ulong)local_830 >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),pcStack_818,(int *)local_820,(int *)pHStack_828);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_848);
  __p = local_830;
  this_00 = pHStack_828;
  lhs = local_820;
  message = pcStack_818;
  file = pcStack_808;
  this_01 = pAStack_7f8;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_7f8);
    testing::AssertionResult::failure_message((AssertionResult *)0xd015ea);
    testing::internal::AssertHelper::AssertHelper(pAStack_7f8,type,pcStack_808,iVar7,pcStack_818);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pHStack_828);
    testing::Message::~Message((Message *)0xd0164d);
    __p = local_830;
    this_00 = pHStack_828;
    lhs = local_820;
    message = pcStack_818;
    file = pcStack_808;
    this_01 = pAStack_7f8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd016be);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_00,
             (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)__p);
  local_96c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_911 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd01789);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_910);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_9f0);
    testing::Message::~Message((Message *)0xd01877);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0190e);
  local_a04 = 1;
  local_a14 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_a10 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd019f3);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd01a56);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd01ac7);
  local_acc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                in_stack_ffffffffffffe3a8);
  key_00 = local_a8;
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_00,(type)__p);
  uVar2 = google::
          sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator!=((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)this_00,(iterator *)__p);
  local_ae1 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd01b82);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ae0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_b18);
    testing::Message::~Message((Message *)0xd01c57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd01cee);
  local_b2c = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd01cfb);
  local_b30 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,(int *)lhs,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd01dae);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd01e11);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd01e7f);
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_00);
  local_b51 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd01ec3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b50);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_b88);
    testing::Message::~Message((Message *)0xd01f98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0202f);
  local_bf4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_b99 = google::
              sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd020d5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b98);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_c78);
    testing::Message::~Message((Message *)0xd021aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02241);
  local_c8c = 1;
  local_c9c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_c98 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c88);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd02317);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd0237a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd023eb);
  local_d54 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_00,__p);
  local_d69 = google::
              sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd02497);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d68);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_da0);
    testing::Message::~Message((Message *)0xd0256c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02603);
  local_db4 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd02610);
  local_db8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,(int *)lhs,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_db0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd026c3);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd02726);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02794);
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_00);
  local_dd9 = google::
              sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd027d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_dd8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_e10);
    testing::Message::~Message((Message *)0xd028ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02944);
  local_e7c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_e21 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd029fd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e20);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_f00);
    testing::Message::~Message((Message *)0xd02ad2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02b69);
  local_f14 = 1;
  local_f24 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_f20 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f10);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd02c4e);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd02cb1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02d22);
  local_fdc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_00,(type)__p);
  local_ff1 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd02ddd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ff0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1028);
    testing::Message::~Message((Message *)0xd02eb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd02f49);
  local_103c = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::iterator::key((iterator *)0xd02f56);
  local_1040 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,(int *)lhs,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1038);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd03009);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd0306c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd030da);
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_00);
  local_1061 = google::
               sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd0311e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1060);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1098);
    testing::Message::~Message((Message *)0xd031f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0328a);
  local_1104 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_10a9 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd03330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10a8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1188);
    testing::Message::~Message((Message *)0xd03405);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0349c);
  local_119c = 1;
  local_11ac = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_11a8 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1198);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd03572);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd035d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd03646);
  local_1264 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_00,__p);
  local_1279 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd036f2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1278);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_12b0);
    testing::Message::~Message((Message *)0xd037c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0385e);
  local_12c4 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::const_iterator::key((const_iterator *)0xd0386b);
  local_12c8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,(int *)lhs,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_12c0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd0391e);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd03981);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd039ef);
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_00);
  local_12e9 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd03a33);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_12e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1320);
    testing::Message::~Message((Message *)0xd03b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd03b9f);
  local_138c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_1331 = google::
               sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd03c46);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1330);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1410);
    testing::Message::~Message((Message *)0xd03d1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd03db2);
  local_1424 = 0;
  local_1434 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_1430 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1420);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd03e97);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd03efa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd03f6b);
  local_14ec = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_00,(type)__p);
  local_1501 = google::
               sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd04014);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1500);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1538);
    testing::Message::~Message((Message *)0xd040e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04180);
  local_15a4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_1549 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd04214);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1548);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1628);
    testing::Message::~Message((Message *)0xd042e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04380);
  local_163c = 0;
  local_164c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_1648 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1638);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd04456);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd044b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0452a);
  local_1704 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_00,__p);
  local_1719 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd045c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1718);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1750);
    testing::Message::~Message((Message *)0xd04699);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04730);
  local_17bc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230),in_stack_ffffffffffffe228)
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(in_stack_ffffffffffffe234,in_stack_ffffffffffffe230));
  local_1761 = google::
               sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd047d7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1760);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1840);
    testing::Message::~Message((Message *)0xd048ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04943);
  local_1854 = 0;
  key = (key_type *)(in_RDI + 0x10);
  kVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_1864 = kVar3;
  local_1860 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)this_00,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1850);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd04a28);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),
               (Message *)in_stack_ffffffffffffe208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd04a8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04afc);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  kVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_191c = kVar4;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  expression_text = local_a8;
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_00,(type)__p);
  local_1931 = google::
               sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd04b9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1930);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text,
               (char *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
               in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar4,in_stack_ffffffffffffe210),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1968);
    testing::Message::~Message((Message *)0xd04c74);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04d0b);
  kVar5 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_19d4 = kVar5;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(kVar3,in_stack_ffffffffffffe230),key);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT44(kVar3,in_stack_ffffffffffffe230));
  local_1979 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd04d99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1978);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text,
               (char *)CONCAT44(kVar5,in_stack_ffffffffffffe1f8),in_stack_ffffffffffffe1f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar4,in_stack_ffffffffffffe210),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1a58);
    testing::Message::~Message((Message *)0xd04e6e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd04f05);
  local_1a6c = 0;
  kVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  local_1a7c = kVar3;
  expected_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)this_00,(key_type *)__p);
  local_1a78 = expected_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar7,uVar6),message,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a68);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xd04fcf);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar4,in_stack_ffffffffffffe210),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xd0502c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0509d);
  local_1b34 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_00,(int)((ulong)__p >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe3b0),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_00,__p);
  local_1b49 = google::
               sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_00,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)__p,(type *)0xd0512b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b48);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text,(char *)CONCAT44(kVar5,kVar3),
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,iVar7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar4,in_stack_ffffffffffffe210),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_1b80);
    testing::Message::~Message((Message *)0xd05200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd05294);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xd052a1);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}